

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

item<mpt::layout::graph> * __thiscall
mpt::item_array<mpt::layout::graph>::append
          (item_array<mpt::layout::graph> *this,graph *t,char *id,int len)

{
  bool bVar1;
  long pos_00;
  long pos;
  item<mpt::layout::graph> *it;
  int len_local;
  char *id_local;
  graph *t_local;
  item_array<mpt::layout::graph> *this_local;
  
  pos_00 = unique_array<mpt::item<mpt::layout::graph>_>::length
                     (&this->super_unique_array<mpt::item<mpt::layout::graph>_>);
  this_local = (item_array<mpt::layout::graph> *)
               unique_array<mpt::item<mpt::layout::graph>_>::insert
                         (&this->super_unique_array<mpt::item<mpt::layout::graph>_>,pos_00);
  if ((item<mpt::layout::graph> *)this_local == (item<mpt::layout::graph> *)0x0) {
    this_local = (item_array<mpt::layout::graph> *)0x0;
  }
  else {
    if ((id != (char *)0x0) &&
       (bVar1 = identifier::set_name
                          (&((item<mpt::layout::graph> *)this_local)->super_identifier,id,len),
       !bVar1)) {
      unique_array<mpt::item<mpt::layout::graph>_>::resize
                (&this->super_unique_array<mpt::item<mpt::layout::graph>_>,pos_00);
      return (item<mpt::layout::graph> *)0x0;
    }
    reference<mpt::layout::graph>::set_instance((reference<mpt::layout::graph> *)this_local,t);
  }
  return (item<mpt::layout::graph> *)this_local;
}

Assistant:

item<T> *append(T *t, const char *id, int len = -1)
	{
		item<T> *it;
		long pos = this->length();
		if (!(it = this->insert(pos))) {
			return 0;
		}
		if (!id || it->identifier::set_name(id, len)) {
			it->set_instance(t);
			return it;
		}
		this->resize(pos);
		return 0;
	}